

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O1

MPI_Datatype
mxx::datatype_builder<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>::get_type(void)

{
  _Rb_tree_header *p_Var1;
  size_t i;
  long lVar2;
  _Base_ptr p_Var3;
  MPI_Datatype struct_type;
  MPI_Datatype _type;
  int blocklen [3];
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  members;
  array<ompi_datatype_t_*,_3UL> mpitypes;
  array<long,_3UL> displs;
  undefined8 local_90;
  MPI_Datatype local_88;
  undefined4 local_7c [3];
  _Rb_tree<long,_std::pair<const_long,_ompi_datatype_t_*>,_std::_Select1st<std::pair<const_long,_ompi_datatype_t_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  local_70;
  undefined8 local_40 [6];
  
  lVar2 = 0;
  do {
    local_7c[lVar2] = 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  p_Var1 = &local_70._M_impl.super__Rb_tree_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  tuple_members<3UL,_3UL,_unsigned_long,_unsigned_long,_unsigned_long>::get
            ((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
              *)&local_70);
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    lVar2 = 0;
    p_Var3 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      *(undefined8 *)((long)local_40 + lVar2 + 0x18) = *(undefined8 *)(p_Var3 + 1);
      *(_Base_ptr *)((long)local_40 + lVar2) = p_Var3[1]._M_parent;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      lVar2 = lVar2 + 8;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  MPI_Type_create_struct(3,local_7c,local_40 + 3,local_40,&local_90);
  MPI_Type_create_resized(local_90,0,0x18,&local_88);
  MPI_Type_commit(&local_88);
  MPI_Type_free(&local_90);
  std::
  _Rb_tree<long,_std::pair<const_long,_ompi_datatype_t_*>,_std::_Select1st<std::pair<const_long,_ompi_datatype_t_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  ::~_Rb_tree(&local_70);
  return local_88;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;
        // fill in the block lengths to 1 each
        int blocklen[size];
        for (std::size_t i = 0; i < size; ++i) {
            blocklen[i] = 1;
        }

        // get the member displacement and type info for the tuple using
        // meta-recursion
        std::map<MPI_Aint, MPI_Datatype> members;
        tuple_members<size,size,Types...>::get(members);


        // fill displacements and types according to in-memory order in tuple
        // NOTE: the in-memory order is not necessarily the same as the order
        // of types as accessed by std::get
        // For gcc the order is actually reversed!
        // Hence, we use a std::map to collect the order information prior
        // to creating the displacement and type arrays
        std::array<MPI_Aint, size> displs;
        std::array<MPI_Datatype, size> mpitypes;
        std::size_t i = 0;
        for (std::map<MPI_Aint, MPI_Datatype>::iterator it = members.begin();
             it != members.end(); ++it) {
            displs[i] = it->first;
            mpitypes[i] = it->second;
            ++i;
        }

        // create type
        MPI_Datatype struct_type;
        MPI_Type_create_struct(size, blocklen, &displs[0], &mpitypes[0], &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(tuple_t), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);

        return _type;
    }